

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

Stream * rw::writeSkinSplitData(Stream *stream,Skin *skin)

{
  Skin *skin_local;
  Stream *stream_local;
  
  Stream::writeI32(stream,skin->boneLimit);
  Stream::writeI32(stream,skin->numMeshes);
  Stream::writeI32(stream,skin->rleSize);
  if (skin->numMeshes != 0) {
    (*stream->_vptr_Stream[3])
              (stream,skin->remapIndices,
               (ulong)(uint)(skin->numBones + (skin->numMeshes + skin->rleSize) * 2));
  }
  return stream;
}

Assistant:

Stream*
writeSkinSplitData(Stream *stream, Skin *skin)
{
	stream->writeI32(skin->boneLimit);
	stream->writeI32(skin->numMeshes);
	stream->writeI32(skin->rleSize);
	if(skin->numMeshes)
		stream->write8(skin->remapIndices,
		              skin->numBones + 2*(skin->numMeshes+skin->rleSize));
	return stream;
}